

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

Abc_Ntk_t * Abc_SclBufferPhase(Abc_Ntk_t *pNtk,int fVerbose)

{
  int nSize;
  Abc_Obj_t *pFanin;
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Abc_Obj_t *p;
  Abc_Obj_t *pAVar5;
  Abc_Ntk_t *pAVar6;
  int Fill;
  int iVar7;
  int i;
  long lVar8;
  int local_48;
  
  if (pNtk->vPhases == (Vec_Int_t *)0x0) {
    __assert_fail("pNtk->vPhases != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclBuffer.c"
                  ,0xcd,"Abc_Ntk_t *Abc_SclBufferPhase(Abc_Ntk_t *, int)");
  }
  nSize = pNtk->vObjs->nSize;
  pVVar4 = Vec_IntStart(nSize);
  local_48 = 0;
  iVar7 = 0;
  iVar3 = 0;
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    p = Abc_NtkObj(pNtk,i);
    if (((p != (Abc_Obj_t *)0x0) && (uVar1 = *(uint *)&p->field_0x14 & 0xf, uVar1 < 8)) &&
       ((0x98U >> uVar1 & 1) != 0)) {
      if (nSize <= i) break;
      for (lVar8 = 0; lVar8 < (p->vFanins).nSize; lVar8 = lVar8 + 1) {
        pFanin = (Abc_Obj_t *)p->pNtk->vObjs->pArray[(p->vFanins).pArray[lVar8]];
        iVar2 = Abc_ObjFaninPhase(p,(int)lVar8);
        if (iVar2 != 0) {
          iVar2 = Vec_IntEntry(pVVar4,pFanin->Id);
          if (((iVar2 == 0) || (uVar1 = *(uint *)&pFanin->field_0x14 & 0xf, uVar1 == 5)) ||
             (uVar1 == 2)) {
            pAVar5 = Abc_NtkCreateNodeInv(pNtk,pFanin);
            Vec_IntWriteEntry(pVVar4,pFanin->Id,pAVar5->Id);
            local_48 = local_48 + 1;
          }
          iVar2 = Vec_IntEntry(pVVar4,pFanin->Id);
          pAVar5 = Abc_NtkObj(pNtk,iVar2);
          Abc_ObjPatchFanin(p,pFanin,pAVar5);
          iVar7 = iVar7 + 1;
        }
      }
      iVar3 = iVar3 + (int)lVar8;
    }
  }
  if (fVerbose != 0) {
    printf("Added %d inverters (%.2f %% fanins) (%.2f %% compl fanins).\n",
           ((double)local_48 * 100.0) / (double)iVar3,((double)iVar7 * 100.0) / (double)iVar3);
  }
  Vec_IntFree(pVVar4);
  Vec_IntFillExtra(pNtk->vPhases,pNtk->vObjs->nSize,Fill);
  pVVar4 = pNtk->vPhases;
  pNtk->vPhases = (Vec_Int_t *)0x0;
  pAVar6 = Abc_NtkDupDfs(pNtk);
  pNtk->vPhases = pVVar4;
  return pAVar6;
}

Assistant:

Abc_Ntk_t * Abc_SclBufferPhase( Abc_Ntk_t * pNtk, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Int_t * vInvs;
    Abc_Obj_t * pObj, * pFanin, * pFaninNew;
    int nNodesOld = Abc_NtkObjNumMax(pNtk);
    int i, k, Counter = 0, Counter2 = 0, Total = 0;
    assert( pNtk->vPhases != NULL );
    vInvs = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        if ( i >= nNodesOld )
            break;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            Total++;
            if ( !Abc_ObjFaninPhase(pObj, k) )
                continue;
            if ( Vec_IntEntry(vInvs, Abc_ObjId(pFanin)) == 0 || Abc_ObjIsCi(pFanin) ) // allow PIs to have high fanout - to be fixed later
            {
                pFaninNew = Abc_NtkCreateNodeInv( pNtk, pFanin );
                Vec_IntWriteEntry( vInvs, Abc_ObjId(pFanin), Abc_ObjId(pFaninNew) );
                Counter++;
            }
            pFaninNew = Abc_NtkObj( pNtk, Vec_IntEntry(vInvs, Abc_ObjId(pFanin)) );
            Abc_ObjPatchFanin( pObj, pFanin, pFaninNew );
            Counter2++;
        }
    }
    if ( fVerbose )
        printf( "Added %d inverters (%.2f %% fanins) (%.2f %% compl fanins).\n", 
            Counter, 100.0 * Counter / Total, 100.0 * Counter2 / Total );
    Vec_IntFree( vInvs );
    Vec_IntFillExtra( pNtk->vPhases, Abc_NtkObjNumMax(pNtk), 0 );
    // duplicate network in topo order
    vInvs = pNtk->vPhases;
    pNtk->vPhases = NULL;
    pNtkNew = Abc_NtkDupDfs( pNtk );
    pNtk->vPhases = vInvs;
    return pNtkNew;
}